

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  char cVar3;
  bool bVar4;
  __int_type _Var5;
  uint32_t uVar6;
  reference pvVar7;
  size_type sVar8;
  reference __rhs;
  pointer pPVar9;
  ostream *poVar10;
  void *pvVar11;
  element_type *routine;
  reference pvVar12;
  pointer pNVar13;
  reference this;
  uint *puVar14;
  double dVar15;
  char *local_3c0;
  uint local_2d0;
  uint local_2cc;
  reference local_2c8;
  Overlap *jt;
  iterator __end4;
  iterator __begin4;
  vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *__range4;
  future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_> *it_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
  *__range3_1;
  uint64_t lhs_offset;
  uint64_t rhs_offset;
  ProgressBar bar;
  reference_wrapper<const_std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>
  local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  undefined1 local_208 [24];
  unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_> *it;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
  *__range3;
  vector<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
  futures;
  invalid_argument *exception_1;
  undefined1 local_1a0 [8];
  vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
  sequences;
  uint64_t num_targets;
  const_iterator local_178;
  __normal_iterator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_*,_std::vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>_>
  local_170;
  const_iterator local_168;
  invalid_argument *exception;
  undefined1 local_140 [8];
  vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
  targets;
  Timer timer;
  undefined1 local_108 [8];
  MinimizerEngine minimizer_engine;
  shared_ptr<thread_pool::ThreadPool> thread_pool;
  unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
  local_a0;
  unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
  local_98;
  unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
  sparser;
  bool is_ava;
  unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
  tparser;
  int local_78;
  int i;
  char arg;
  char *optstr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  input_paths;
  uint32_t num_threads;
  bool minhash;
  double frequency;
  uint32_t gap;
  uint32_t matches;
  uint32_t chain;
  uint32_t bandwidth;
  uint32_t w;
  uint32_t k;
  char **argv_local;
  int argc_local;
  
  bandwidth = 0xf;
  chain = 5;
  matches = 500;
  gap = 4;
  frequency._4_4_ = 100;
  frequency._0_4_ = 10000;
  _num_threads = 0.001;
  input_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  input_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&optstr);
  while (cVar3 = getopt_long(argc,argv,"k:w:f:t:h",(anonymous_namespace)::options,0), cVar3 != -1) {
    switch(cVar3) {
    case 'M':
      input_paths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      break;
    default:
      argv_local._4_4_ = 1;
      goto LAB_00106b03;
    case 'b':
      matches = atoi(_optarg);
      break;
    case 'c':
      gap = atoi(_optarg);
      break;
    case 'f':
      _num_threads = atof(_optarg);
      break;
    case 'g':
      frequency._0_4_ = atoi(_optarg);
      break;
    case 'h':
      anon_unknown.dwarf_1a9f8::Help();
      argv_local._4_4_ = 0;
      goto LAB_00106b03;
    case 'k':
      bandwidth = atoi(_optarg);
      break;
    case 'm':
      frequency._4_4_ = atoi(_optarg);
      break;
    case 't':
      input_paths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = atoi(_optarg);
      break;
    case 'v':
      poVar10 = std::operator<<((ostream *)&std::cout,"2.2.0");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 0;
      goto LAB_00106b03;
    case 'w':
      chain = atoi(_optarg);
    }
  }
  if (argc == 1) {
    anon_unknown.dwarf_1a9f8::Help();
    argv_local._4_4_ = 0;
    goto LAB_00106b03;
  }
  for (tparser._M_t.
       super___uniq_ptr_impl<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
       .super__Head_base<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_false>._M_head_impl._4_4_ =
            _optind;
      tparser._M_t.
      super___uniq_ptr_impl<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
      .super__Head_base<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_false>._M_head_impl._4_4_ <
      argc; tparser._M_t.
            super___uniq_ptr_impl<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
            .super__Head_base<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_false>._M_head_impl.
            _4_4_ = tparser._M_t.
                    super___uniq_ptr_impl<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                    .super__Head_base<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_false>.
                    _M_head_impl._4_4_ + 1) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&optstr,
               argv + tparser._M_t.
                      super___uniq_ptr_impl<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                      .super__Head_base<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_false>.
                      _M_head_impl._4_4_);
  }
  bVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&optstr);
  if (bVar4) {
    poVar10 = std::operator<<((ostream *)&std::cerr,"[ram::] error: missing target file");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
    goto LAB_00106b03;
  }
  pvVar7 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&optstr,0);
  anon_unknown.dwarf_1a9f8::CreateParser
            ((anon_unknown_dwarf_1a9f8 *)&stack0xffffffffffffff78,pvVar7);
  bVar4 = std::operator==((unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                           *)&stack0xffffffffffffff78,(nullptr_t)0x0);
  if (bVar4) {
    argv_local._4_4_ = 1;
  }
  else {
    sparser._M_t.
    super___uniq_ptr_impl<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
    .super__Head_base<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_false>._M_head_impl._7_1_ = 0;
    std::
    unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,std::default_delete<bioparser::Parser<biosoup::NucleicAcid>>>
    ::unique_ptr<std::default_delete<bioparser::Parser<biosoup::NucleicAcid>>,void>
              ((unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,std::default_delete<bioparser::Parser<biosoup::NucleicAcid>>>
                *)&local_98,(nullptr_t)0x0);
    sVar8 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&optstr);
    if (sVar8 < 2) {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&optstr,0);
      anon_unknown.dwarf_1a9f8::CreateParser
                ((anon_unknown_dwarf_1a9f8 *)
                 &thread_pool.
                  super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,pvVar7);
      std::
      unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
      ::operator=(&local_98,
                  (unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                   *)&thread_pool.
                      super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
      std::
      unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
      ::~unique_ptr((unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                     *)&thread_pool.
                        super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
      sparser._M_t.
      super___uniq_ptr_impl<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
      .super__Head_base<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_false>._M_head_impl._7_1_ =
           true;
LAB_00105b81:
      std::make_shared<thread_pool::ThreadPool,unsigned_int&>
                ((uint *)&minimizer_engine.thread_pool_.
                          super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      std::shared_ptr<thread_pool::ThreadPool>::shared_ptr
                ((shared_ptr<thread_pool::ThreadPool> *)&timer.elapsed_time_,
                 (shared_ptr<thread_pool::ThreadPool> *)
                 &minimizer_engine.thread_pool_.
                  super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ram::MinimizerEngine::MinimizerEngine
                ((MinimizerEngine *)local_108,
                 (shared_ptr<thread_pool::ThreadPool> *)&timer.elapsed_time_,bandwidth,chain,matches
                 ,gap,frequency._4_4_,frequency._0_4_);
      std::shared_ptr<thread_pool::ThreadPool>::~shared_ptr
                ((shared_ptr<thread_pool::ThreadPool> *)&timer.elapsed_time_);
      biosoup::Timer::Timer
                ((Timer *)&targets.
                           super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      do {
        biosoup::Timer::Start
                  ((Timer *)&targets.
                             super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ::vector((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                  *)local_140);
        pPVar9 = std::
                 unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                 ::operator->((unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                               *)&stack0xffffffffffffff78);
        (*pPVar9->_vptr_Parser[2])(&exception,pPVar9,0x100000000,1);
        std::
        vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ::operator=((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                     *)local_140,
                    (vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                     *)&exception);
        std::
        vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ::~vector((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                   *)&exception);
        bVar4 = std::
                vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                ::empty((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                         *)local_140);
        if (bVar4) {
          local_78 = 9;
        }
        else {
          poVar10 = std::operator<<((ostream *)&std::cerr,"[ram::] parsed ");
          sVar8 = std::
                  vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                  ::size((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                          *)local_140);
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,sVar8);
          poVar10 = std::operator<<(poVar10," targets ");
          pvVar11 = (void *)std::ostream::operator<<(poVar10,std::fixed);
          dVar15 = biosoup::Timer::Stop
                             ((Timer *)&targets.
                                        super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          poVar10 = (ostream *)std::ostream::operator<<(pvVar11,dVar15);
          poVar10 = std::operator<<(poVar10,"s");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          biosoup::Timer::Start
                    ((Timer *)&targets.
                               super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_170._M_current =
               (unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_> *)
               std::
               vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
               ::begin((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                        *)local_140);
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>
          ::
          __normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>*>
                    ((__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>
                      *)&local_168,&local_170);
          num_targets = (uint64_t)
                        std::
                        vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                        ::end((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                               *)local_140);
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>
          ::
          __normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>*>
                    ((__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>
                      *)&local_178,
                     (__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_*,_std::vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>_>
                      *)&num_targets);
          ram::MinimizerEngine::Minimize
                    ((MinimizerEngine *)local_108,local_168,local_178,
                     (bool)(input_paths.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
          ram::MinimizerEngine::Filter((MinimizerEngine *)local_108,_num_threads);
          poVar10 = std::operator<<((ostream *)&std::cerr,"[ram::] minimized targets ");
          pvVar11 = (void *)std::ostream::operator<<(poVar10,std::fixed);
          dVar15 = biosoup::Timer::Stop
                             ((Timer *)&targets.
                                        super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          poVar10 = (ostream *)std::ostream::operator<<(pvVar11,dVar15);
          poVar10 = std::operator<<(poVar10,"s");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          _Var5 = std::__atomic_base::operator_cast_to_unsigned_int
                            ((__atomic_base *)&biosoup::NucleicAcid::num_objects);
          sequences.
          super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)_Var5;
          std::__atomic_base<unsigned_int>::operator=
                    (&biosoup::NucleicAcid::num_objects.super___atomic_base<unsigned_int>,0);
          do {
            biosoup::Timer::Start
                      ((Timer *)&targets.
                                 super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::
            vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
            ::vector((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                      *)local_1a0);
            pPVar9 = std::
                     unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                     ::operator->(&local_98);
            (*pPVar9->_vptr_Parser[2])(&exception_1,pPVar9,0x40000000,1);
            std::
            vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
            ::operator=((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                         *)local_1a0,
                        (vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                         *)&exception_1);
            std::
            vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
            ::~vector((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                       *)&exception_1);
            bVar4 = std::
                    vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                    ::empty((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                             *)local_1a0);
            if (bVar4) {
              local_78 = 0xb;
            }
            else {
              std::
              vector<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
              ::vector((vector<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
                        *)&__range3);
              __end3 = std::
                       vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                       ::begin((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                                *)local_1a0);
              it = (unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_> *)
                   std::
                   vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                   ::end((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                          *)local_1a0);
              while (bVar4 = __gnu_cxx::operator!=
                                       (&__end3,(__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_*,_std::vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>_>
                                                 *)&it), bVar4) {
                local_208._16_8_ =
                     __gnu_cxx::
                     __normal_iterator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_*,_std::vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>_>
                     ::operator*(&__end3);
                if (((sparser._M_t.
                      super___uniq_ptr_impl<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                      .super__Head_base<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_false>.
                      _M_head_impl._7_1_ & 1) == 0) ||
                   (pNVar13 = std::
                              unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                              ::operator->((unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                                            *)local_208._16_8_),
                   (pointer)(ulong)pNVar13->id <
                   sequences.
                   super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)) {
                  routine = std::
                            __shared_ptr_access<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)&minimizer_engine.thread_pool_.
                                             super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount);
                  local_220._M_data =
                       (unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                        *)local_108;
                  local_218 = (undefined1 *)
                              ((long)&sparser._M_t.
                                      super___uniq_ptr_impl<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                                      .
                                      super__Head_base<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_false>
                                      ._M_head_impl + 7);
                  local_210 = (undefined1 *)
                              ((long)&input_paths.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                  bar.events_per_tick_ =
                       (double)std::
                               ref<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const>
                                         ((unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                                           *)local_208._16_8_);
                  ::thread_pool::ThreadPool::
                  Submit<main::__0,std::reference_wrapper<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const>>
                            ((ThreadPool *)local_208,(anon_class_24_3_ca6a3cbd_for__M_f *)routine,
                             &local_220);
                  std::
                  vector<std::future<std::vector<biosoup::Overlap,std::allocator<biosoup::Overlap>>>,std::allocator<std::future<std::vector<biosoup::Overlap,std::allocator<biosoup::Overlap>>>>>
                  ::
                  emplace_back<std::future<std::vector<biosoup::Overlap,std::allocator<biosoup::Overlap>>>>
                            ((vector<std::future<std::vector<biosoup::Overlap,std::allocator<biosoup::Overlap>>>,std::allocator<std::future<std::vector<biosoup::Overlap,std::allocator<biosoup::Overlap>>>>>
                              *)&__range3,
                             (future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>
                              *)local_208);
                  std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>::
                  ~future((future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>
                           *)local_208);
                }
                __gnu_cxx::
                __normal_iterator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_*,_std::vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>_>
                ::operator++(&__end3);
              }
              sVar8 = std::
                      vector<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
                      ::size((vector<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
                              *)&__range3);
              biosoup::ProgressBar::ProgressBar((ProgressBar *)&rhs_offset,(uint32_t)sVar8,0x10);
              pvVar12 = std::
                        vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                        ::front((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                                 *)local_140);
              pNVar13 = std::
                        unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                        ::operator->(pvVar12);
              uVar1 = pNVar13->id;
              pvVar12 = std::
                        vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                        ::front((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                                 *)local_1a0);
              pNVar13 = std::
                        unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                        ::operator->(pvVar12);
              uVar2 = pNVar13->id;
              __end3_1 = std::
                         vector<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
                         ::begin((vector<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
                                  *)&__range3);
              it_1 = (future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_> *)
                     std::
                     vector<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
                     ::end((vector<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
                            *)&__range3);
              while (bVar4 = __gnu_cxx::operator!=
                                       (&__end3_1,
                                        (__normal_iterator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_*,_std::vector<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>_>
                                         *)&it_1), bVar4) {
                this = __gnu_cxx::
                       __normal_iterator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_*,_std::vector<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>_>
                       ::operator*(&__end3_1);
                std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>::get
                          ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)&__begin4,
                           this);
                __end4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::begin
                                   ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                                    &__begin4);
                jt = (Overlap *)
                     std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::end
                               ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                                &__begin4);
                while (bVar4 = __gnu_cxx::operator!=
                                         (&__end4,(
                                                  __normal_iterator<biosoup::Overlap_*,_std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>
                                                  *)&jt), bVar4) {
                  local_2c8 = __gnu_cxx::
                              __normal_iterator<biosoup::Overlap_*,_std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>
                              ::operator*(&__end4);
                  pvVar12 = std::
                            vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                            ::operator[]((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                                          *)local_1a0,(ulong)local_2c8->lhs_id - (ulong)uVar2);
                  pNVar13 = std::
                            unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                            ::operator->(pvVar12);
                  poVar10 = std::operator<<((ostream *)&std::cout,(string *)&pNVar13->name);
                  poVar10 = std::operator<<(poVar10,"\t");
                  pvVar12 = std::
                            vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                            ::operator[]((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                                          *)local_1a0,(ulong)local_2c8->lhs_id - (ulong)uVar2);
                  pNVar13 = std::
                            unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                            ::operator->(pvVar12);
                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,pNVar13->inflated_len);
                  poVar10 = std::operator<<(poVar10,"\t");
                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_2c8->lhs_begin);
                  poVar10 = std::operator<<(poVar10,"\t");
                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_2c8->lhs_end);
                  poVar10 = std::operator<<(poVar10,"\t");
                  if ((local_2c8->strand & 1U) == 0) {
                    local_3c0 = "-";
                  }
                  else {
                    local_3c0 = "+";
                  }
                  poVar10 = std::operator<<(poVar10,local_3c0);
                  poVar10 = std::operator<<(poVar10,"\t");
                  pvVar12 = std::
                            vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                            ::operator[]((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                                          *)local_140,(ulong)local_2c8->rhs_id - (ulong)uVar1);
                  pNVar13 = std::
                            unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                            ::operator->(pvVar12);
                  poVar10 = std::operator<<(poVar10,(string *)&pNVar13->name);
                  poVar10 = std::operator<<(poVar10,"\t");
                  pvVar12 = std::
                            vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                            ::operator[]((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                                          *)local_140,(ulong)local_2c8->rhs_id - (ulong)uVar1);
                  pNVar13 = std::
                            unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                            ::operator->(pvVar12);
                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,pNVar13->inflated_len);
                  poVar10 = std::operator<<(poVar10,"\t");
                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_2c8->rhs_begin);
                  poVar10 = std::operator<<(poVar10,"\t");
                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_2c8->rhs_end);
                  poVar10 = std::operator<<(poVar10,"\t");
                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_2c8->score);
                  poVar10 = std::operator<<(poVar10,"\t");
                  local_2cc = local_2c8->lhs_end - local_2c8->lhs_begin;
                  local_2d0 = local_2c8->rhs_end - local_2c8->rhs_begin;
                  puVar14 = std::max<unsigned_int>(&local_2cc,&local_2d0);
                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,*puVar14);
                  poVar10 = std::operator<<(poVar10,"\t");
                  pvVar11 = (void *)std::ostream::operator<<(poVar10,0xff);
                  std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
                  __gnu_cxx::
                  __normal_iterator<biosoup::Overlap_*,_std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>
                  ::operator++(&__end4);
                }
                std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::~vector
                          ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)&__begin4)
                ;
                bVar4 = biosoup::ProgressBar::operator++((ProgressBar *)&rhs_offset);
                if (bVar4) {
                  poVar10 = std::operator<<((ostream *)&std::cerr,"[ram::] mapped ");
                  uVar6 = biosoup::ProgressBar::event_counter((ProgressBar *)&rhs_offset);
                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,uVar6);
                  poVar10 = std::operator<<(poVar10," sequences ");
                  poVar10 = std::operator<<(poVar10,"[");
                  poVar10 = biosoup::operator<<(poVar10,(ProgressBar *)&rhs_offset);
                  poVar10 = std::operator<<(poVar10,"] ");
                  pvVar11 = (void *)std::ostream::operator<<(poVar10,std::fixed);
                  dVar15 = biosoup::Timer::Lap((Timer *)&targets.
                                                  super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              );
                  poVar10 = (ostream *)std::ostream::operator<<(pvVar11,dVar15);
                  poVar10 = std::operator<<(poVar10,"s");
                  std::operator<<(poVar10,"\r");
                }
                __gnu_cxx::
                __normal_iterator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_*,_std::vector<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>_>
                ::operator++(&__end3_1);
              }
              std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
              biosoup::Timer::Stop
                        ((Timer *)&targets.
                                   super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if (((sparser._M_t.
                    super___uniq_ptr_impl<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                    .super__Head_base<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_false>.
                    _M_head_impl._7_1_ & 1) == 0) ||
                 (_Var5 = std::__atomic_base::operator_cast_to_unsigned_int
                                    ((__atomic_base *)&biosoup::NucleicAcid::num_objects),
                 (pointer)(ulong)_Var5 <
                 sequences.
                 super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)) {
                local_78 = 0;
              }
              else {
                local_78 = 0xb;
              }
              biosoup::ProgressBar::~ProgressBar((ProgressBar *)&rhs_offset);
              std::
              vector<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
              ::~vector((vector<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
                         *)&__range3);
            }
            std::
            vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
            ::~vector((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                       *)local_1a0);
          } while (local_78 == 0);
          if (local_78 == 0xb) {
            pPVar9 = std::
                     unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                     ::operator->(&local_98);
            bioparser::Parser<biosoup::NucleicAcid>::Reset(pPVar9);
            std::__atomic_base<unsigned_int>::operator=
                      (&biosoup::NucleicAcid::num_objects.super___atomic_base<unsigned_int>,
                       (__int_type)
                       sequences.
                       super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_78 = 0;
          }
        }
        std::
        vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ::~vector((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                   *)local_140);
      } while (local_78 == 0);
      if (local_78 == 9) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"[ram::] ");
        dVar15 = biosoup::Timer::elapsed_time
                           ((Timer *)&targets.
                                      super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar15);
        poVar10 = std::operator<<(poVar10,"s");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      }
      argv_local._4_4_ = 0;
      ram::MinimizerEngine::~MinimizerEngine((MinimizerEngine *)local_108);
      std::shared_ptr<thread_pool::ThreadPool>::~shared_ptr
                ((shared_ptr<thread_pool::ThreadPool> *)
                 &minimizer_engine.thread_pool_.
                  super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    else {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&optstr,1);
      anon_unknown.dwarf_1a9f8::CreateParser((anon_unknown_dwarf_1a9f8 *)&local_a0,pvVar7);
      std::
      unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
      ::operator=(&local_98,&local_a0);
      std::
      unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
      ::~unique_ptr(&local_a0);
      bVar4 = std::operator==(&local_98,(nullptr_t)0x0);
      if (!bVar4) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&optstr,0);
        __rhs = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&optstr,1);
        sparser._M_t.
        super___uniq_ptr_impl<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
        .super__Head_base<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_false>._M_head_impl._7_1_
             = std::operator==(pvVar7,__rhs);
        goto LAB_00105b81;
      }
      argv_local._4_4_ = 1;
    }
    std::
    unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
    ::~unique_ptr(&local_98);
  }
  std::
  unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
  ::~unique_ptr((unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                 *)&stack0xffffffffffffff78);
LAB_00106b03:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&optstr);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
  std::uint32_t k = 15;
  std::uint32_t w = 5;
  std::uint32_t bandwidth = 500;
  std::uint32_t chain = 4;
  std::uint32_t matches = 100;
  std::uint32_t gap = 10000;
  double frequency = 0.001;
  bool minhash = false;
  std::uint32_t num_threads = 1;

  std::vector<std::string> input_paths;

  const char* optstr = "k:w:f:t:h";
  char arg;
  while ((arg = getopt_long(argc, argv, optstr, options, nullptr)) != -1) {
    switch (arg) {
      case 'k': k = std::atoi(optarg); break;
      case 'w': w = std::atoi(optarg); break;
      case 'b': bandwidth = std::atoi(optarg); break;
      case 'c': chain = std::atoi(optarg); break;
      case 'm': matches = std::atoi(optarg); break;
      case 'g': gap = std::atoi(optarg); break;
      case 'f': frequency = std::atof(optarg); break;
      case 'M': minhash = true; break;
      case 't': num_threads = std::atoi(optarg); break;
      case 'v': std::cout << VERSION << std::endl; return 0;
      case 'h': Help(); return 0;
      default: return 1;
    }
  }

  if (argc == 1) {
    Help();
    return 0;
  }

  for (auto i = optind; i < argc; ++i) {
    input_paths.emplace_back(argv[i]);
  }

  if (input_paths.empty()) {
    std::cerr << "[ram::] error: missing target file" << std::endl;
    return 1;
  }

  auto tparser = CreateParser(input_paths[0]);
  if (tparser == nullptr) {
    return 1;
  }

  bool is_ava = false;
  std::unique_ptr<bioparser::Parser<biosoup::NucleicAcid>> sparser = nullptr;
  if (input_paths.size() > 1) {
    sparser = CreateParser(input_paths[1]);
    if (sparser == nullptr) {
      return 1;
    }
    is_ava = input_paths[0] == input_paths[1];
  } else {
    sparser = CreateParser(input_paths[0]);
    is_ava = true;
  }

  auto thread_pool = std::make_shared<thread_pool::ThreadPool>(num_threads);
  ram::MinimizerEngine minimizer_engine{
      thread_pool,
      k,
      w,
      bandwidth,
      chain,
      matches,
      gap};

  biosoup::Timer timer{};

  while (true) {
    timer.Start();

    std::vector<std::unique_ptr<biosoup::NucleicAcid>> targets;
    try {
      targets = tparser->Parse(1ULL << 32);
    } catch (std::invalid_argument& exception) {
      std::cerr << exception.what() << std::endl;
      return 1;
    }

    if (targets.empty()) {
      break;
    }

    std::cerr << "[ram::] parsed " << targets.size() << " targets "
              << std::fixed << timer.Stop() << "s"
              << std::endl;

    timer.Start();

    minimizer_engine.Minimize(targets.begin(), targets.end(), minhash);
    minimizer_engine.Filter(frequency);

    std::cerr << "[ram::] minimized targets "
              << std::fixed << timer.Stop() << "s"
              << std::endl;

    std::uint64_t num_targets = biosoup::NucleicAcid::num_objects;
    biosoup::NucleicAcid::num_objects = 0;

    while (true) {
      timer.Start();

      std::vector<std::unique_ptr<biosoup::NucleicAcid>> sequences;
      try {
        sequences = sparser->Parse(1U << 30);
      } catch (std::invalid_argument& exception) {
        std::cerr << exception.what() << std::endl;
        return 1;
      }

      if (sequences.empty()) {
        break;
      }

      std::vector<std::future<std::vector<biosoup::Overlap>>> futures;
      for (const auto& it : sequences) {
        if (is_ava && it->id >= num_targets) {
          continue;
        }
        futures.emplace_back(thread_pool->Submit(
            [&] (const std::unique_ptr<biosoup::NucleicAcid>& sequence)
                -> std::vector<biosoup::Overlap> {
              return minimizer_engine.Map(sequence, is_ava, is_ava, minhash);
            },
            std::ref(it)));
      }

      biosoup::ProgressBar bar{
          static_cast<std::uint32_t>(futures.size()), 16};

      std::uint64_t rhs_offset = targets.front()->id;
      std::uint64_t lhs_offset = sequences.front()->id;
      for (auto& it : futures) {
        for (const auto& jt : it.get()) {
          std::cout << sequences[jt.lhs_id - lhs_offset]->name << "\t"
                    << sequences[jt.lhs_id - lhs_offset]->inflated_len << "\t"
                    << jt.lhs_begin << "\t"
                    << jt.lhs_end << "\t"
                    << (jt.strand ? "+" : "-") << "\t"
                    << targets[jt.rhs_id - rhs_offset]->name << "\t"
                    << targets[jt.rhs_id - rhs_offset]->inflated_len << "\t"
                    << jt.rhs_begin << "\t"
                    << jt.rhs_end << "\t"
                    << jt.score << "\t"
                    << std::max(
                          jt.lhs_end - jt.lhs_begin,
                          jt.rhs_end - jt.rhs_begin) << "\t"
                    << 255
                    << std::endl;
        }

        if (++bar) {
          std::cerr << "[ram::] mapped " << bar.event_counter() << " sequences "
                    << "[" << bar << "] "
                    << std::fixed << timer.Lap() << "s"
                    << "\r";
        }
      }
      std::cerr << std::endl;
      timer.Stop();

      if (is_ava && biosoup::NucleicAcid::num_objects >= num_targets) {
        break;
      }
    }

    sparser->Reset();
    biosoup::NucleicAcid::num_objects = num_targets;
  }

  std::cerr << "[ram::] " << timer.elapsed_time() << "s" << std::endl;

  return 0;
}